

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O2

void __thiscall crnlib::dxt3_block::flip_x(dxt3_block *this,uint w,uint h)

{
  uint value;
  uint value_00;
  uint y;
  uint y_00;
  uint x;
  uint x_00;
  
  for (x_00 = 0; x_00 != w >> 1; x_00 = x_00 + 1) {
    for (y_00 = 0; h != y_00; y_00 = y_00 + 1) {
      value = get_alpha(this,x_00,y_00,false);
      value_00 = get_alpha(this,~x_00 + w,y_00,false);
      set_alpha(this,x_00,y_00,value_00,false);
      set_alpha(this,~x_00 + w,y_00,value,false);
    }
  }
  return;
}

Assistant:

inline void flip_x(uint w = 4, uint h = 4)
        {
            for (uint x = 0; x < (w / 2); x++)
            {
                for (uint y = 0; y < h; y++)
                {
                    const uint c = get_alpha(x, y, false);
                    set_alpha(x, y, get_alpha((w - 1) - x, y, false), false);
                    set_alpha((w - 1) - x, y, c, false);
                }
            }
        }